

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfo>::reallocate
          (QPodArrayOps<QAbstractEventDispatcher::TimerInfo> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QTypedArrayData<QAbstractEventDispatcher::TimerInfo>_*,_QAbstractEventDispatcher::TimerInfo_*>
  pVar1;
  
  pVar1 = QTypedArrayData<QAbstractEventDispatcher::TimerInfo>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>).d,
                     (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>).ptr,alloc,
                     option);
  if (pVar1.second != (TimerInfo *)0x0) {
    (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>).d = pVar1.first;
    (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfo>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }